

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composite.cc
# Opt level: O0

int __thiscall Composite::traverse(Composite *this)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  reference ppCVar4;
  int local_14;
  int i;
  Composite *this_local;
  
  local_14 = 0;
  while( true ) {
    sVar3 = std::vector<Component_*,_std::allocator<Component_*>_>::size(&this->children);
    if (sVar3 <= (ulong)(long)local_14) break;
    iVar1 = this->value;
    ppCVar4 = std::vector<Component_*,_std::allocator<Component_*>_>::operator[]
                        (&this->children,(long)local_14);
    iVar2 = (**(*ppCVar4)->_vptr_Component)();
    this->value = iVar1 + iVar2;
    local_14 = local_14 + 1;
  }
  return this->value;
}

Assistant:

int traverse() {
    for (int i = 0; i < children.size(); i++) {
      value = value + children[i]->traverse();
    }
    return value;
  }